

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O1

void new_light_source(level *lev,xchar x,xchar y,int range,int type,void *id)

{
  ls_t *plVar1;
  
  if (range - 0x10U < 0xfffffff1) {
    impossible("new_light_source:  illegal range %d",(ulong)(uint)range);
    return;
  }
  plVar1 = (ls_t *)malloc(0x18);
  plVar1->next = lev->lev_lights;
  plVar1->x = x;
  plVar1->y = y;
  plVar1->range = (short)range;
  plVar1->type = (short)type;
  plVar1->id = id;
  plVar1->flags = 0;
  lev->lev_lights = plVar1;
  vision_full_recalc = '\x01';
  return;
}

Assistant:

void new_light_source(struct level *lev, xchar x, xchar y, int range, int type, void *id)
{
    light_source *ls;

    if (range > MAX_RADIUS || range < 1) {
	impossible("new_light_source:  illegal range %d", range);
	return;
    }

    ls = malloc(sizeof(light_source));

    ls->next = lev->lev_lights;
    ls->x = x;
    ls->y = y;
    ls->range = range;
    ls->type = type;
    ls->id = id;
    ls->flags = 0;
    lev->lev_lights = ls;

    vision_full_recalc = 1;	/* make the source show up */
}